

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O0

void __thiscall TPZIntPrism3D::SetOrder(TPZIntPrism3D *this,TPZVec<int> *ord,int type)

{
  int *piVar1;
  TPZManVector<int,_2> *this_00;
  TPZVec<int> *in_RSI;
  long in_RDI;
  TPZManVector<int,_2> prc2;
  TPZManVector<int,_2> prc1;
  TPZVec<int> *in_stack_ffffffffffffff18;
  TPZIntTriang *in_stack_ffffffffffffff20;
  TPZVec<int> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int iVar2;
  int64_t in_stack_ffffffffffffff38;
  TPZManVector<int,_2> *in_stack_ffffffffffffff40;
  int local_84;
  TPZVec<int> local_68;
  TPZVec<int> local_40;
  TPZVec<int> *local_10;
  
  local_10 = in_RSI;
  piVar1 = TPZVec<int>::operator[](in_RSI,0);
  *(int *)(in_RDI + 8) = *piVar1;
  piVar1 = TPZVec<int>::operator[](local_10,1);
  iVar2 = *piVar1;
  piVar1 = TPZVec<int>::operator[](local_10,2);
  if (*piVar1 < iVar2) {
    piVar1 = TPZVec<int>::operator[](local_10,1);
    local_84 = *piVar1;
  }
  else {
    piVar1 = TPZVec<int>::operator[](local_10,2);
    local_84 = *piVar1;
  }
  *(int *)(in_RDI + 0xc) = local_84;
  TPZManVector<int,_2>::TPZManVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  TPZManVector<int,_2>::TPZManVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  piVar1 = TPZVec<int>::operator[](local_10,0);
  iVar2 = *piVar1;
  piVar1 = TPZVec<int>::operator[](&local_40,0);
  *piVar1 = iVar2;
  piVar1 = TPZVec<int>::operator[](local_10,1);
  iVar2 = *piVar1;
  piVar1 = TPZVec<int>::operator[](&local_68,0);
  *piVar1 = iVar2;
  piVar1 = TPZVec<int>::operator[](local_10,2);
  iVar2 = *piVar1;
  piVar1 = TPZVec<int>::operator[](&local_68,1);
  *piVar1 = iVar2;
  TPZInt1d::SetOrder((TPZInt1d *)CONCAT44(iVar2,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
                     ,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  TPZIntTriang::SetOrder
            ((TPZIntTriang *)CONCAT44(iVar2,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28,
             (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  TPZInt1d::GetOrder((TPZInt1d *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZIntTriang::GetOrder(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  piVar1 = TPZVec<int>::operator[](&local_40,0);
  *(int *)(in_RDI + 8) = *piVar1;
  this_00 = (TPZManVector<int,_2> *)TPZVec<int>::operator[](&local_68,0);
  *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)&(this_00->super_TPZVec<int>)._vptr_TPZVec;
  TPZManVector<int,_2>::~TPZManVector(this_00);
  TPZManVector<int,_2>::~TPZManVector(this_00);
  return;
}

Assistant:

void TPZIntPrism3D::SetOrder(TPZVec<int> &ord,int type) {	
	fOrdKsi = ord[0];   //ordem na reta : zeta
	fOrdKti = (ord[1] > ord[2]) ? ord[1] : ord[2];   //ordem no plano XY
	TPZManVector<int,2> prc1(1),prc2(2);
	prc1[0] = ord[0];
	prc2[0] = ord[1];
	prc2[1] = ord[2];
	fIntRule1D.SetOrder(prc1,type);
	fIntTriang.SetOrder(prc2);
    fIntRule1D.GetOrder(prc1);
    fIntTriang.GetOrder(prc2);
    fOrdKsi = prc1[0];
    fOrdKti = prc2[0];
}